

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlNodePtr xmlTextReaderPreserve(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  _xmlNode *p_Var2;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (pxVar1 = reader->node, pxVar1 == (xmlNodePtr)0x0)) {
    pxVar1 = (xmlNodePtr)0x0;
  }
  else {
    if ((pxVar1->type != XML_DOCUMENT_NODE) && (pxVar1->type != XML_DTD_NODE)) {
      *(byte *)&pxVar1->extra = (byte)pxVar1->extra | 6;
    }
    reader->preserves = reader->preserves + 1;
    for (p_Var2 = pxVar1->parent; p_Var2 != (_xmlNode *)0x0; p_Var2 = p_Var2->parent) {
      if (p_Var2->type == XML_ELEMENT_NODE) {
        *(byte *)&p_Var2->extra = (byte)p_Var2->extra | 2;
      }
    }
  }
  return pxVar1;
}

Assistant:

xmlNodePtr
xmlTextReaderPreserve(xmlTextReaderPtr reader) {
    xmlNodePtr cur, parent;

    if (reader == NULL)
	return(NULL);

    cur = reader->node;
    if (cur == NULL)
        return(NULL);

    if ((cur->type != XML_DOCUMENT_NODE) && (cur->type != XML_DTD_NODE)) {
	cur->extra |= NODE_IS_PRESERVED;
	cur->extra |= NODE_IS_SPRESERVED;
    }
    reader->preserves++;

    parent = cur->parent;;
    while (parent != NULL) {
        if (parent->type == XML_ELEMENT_NODE)
	    parent->extra |= NODE_IS_PRESERVED;
	parent = parent->parent;
    }
    return(cur);
}